

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxStackVariable::FxStackVariable(FxStackVariable *this,PType *type,int offset,FScriptPosition *pos)

{
  uint in_EAX;
  PField *this_00;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  FxExpression::FxExpression(&this->super_FxExpression,EFX_StackVariable,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxStackVariable_00706960;
  this_00 = (PField *)DObject::operator_new(0x40);
  uStack_28 = (ulong)(uint)uStack_28;
  PField::PField(this_00,(FName *)((long)&uStack_28 + 4),type,0,(long)offset,0);
  this->membervar = this_00;
  this->AddressRequested = false;
  this->AddressWritable = true;
  return;
}

Assistant:

FxStackVariable::FxStackVariable(PType *type, int offset, const FScriptPosition &pos)
	: FxExpression(EFX_StackVariable, pos)
{
	membervar = new PField(NAME_None, type, 0, offset);
	AddressRequested = false;
	AddressWritable = true;	// must be true unless classx tells us otherwise if requested.
}